

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void unlink_objsymbol(Symbol *delsym)

{
  long lVar1;
  unsigned_long uVar2;
  long in_RDI;
  Symbol *sym;
  Symbol **chain;
  ObjectUnit *ou;
  char *fn;
  long local_30;
  long *local_20;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    local_30 = 0;
  }
  else {
    local_30 = *(long *)(*(long *)(in_RDI + 0x38) + 0x10);
  }
  if (local_30 == 0) {
    ierror("%s %s has no object or section","unlink_objsymbol():",*(undefined8 *)(in_RDI + 0x20));
  }
  else {
    lVar1 = *(long *)(local_30 + 0x48);
    uVar2 = elf_hash(*(char **)(in_RDI + 0x20));
    local_20 = (long *)(lVar1 + (uVar2 & 0x1f) * 8);
    while ((lVar1 = *local_20, lVar1 != 0 && (lVar1 != in_RDI))) {
      local_20 = (long *)(lVar1 + 0x18);
    }
    if (lVar1 == 0) {
      ierror("%s %s could not be found in any object","unlink_objsymbol():",
             *(undefined8 *)(in_RDI + 0x20));
    }
    else {
      *local_20 = *(long *)(in_RDI + 0x18);
      *(undefined8 *)(in_RDI + 0x18) = 0;
    }
  }
  return;
}

Assistant:

static void unlink_objsymbol(struct Symbol *delsym)
/* unlink a symbol from an object unit's hash chain */
{
  const char *fn = "unlink_objsymbol():";
  struct ObjectUnit *ou = delsym->relsect ? delsym->relsect->obj : NULL;

  if (ou) {
    struct Symbol **chain = &ou->objsyms[elf_hash(delsym->name)%OBJSYMHTABSIZE];
    struct Symbol *sym;

    while (sym = *chain) {
      if (sym == delsym)
        break;
      chain = &sym->obj_chain;
    }
    if (sym) {
      /* unlink the symbol node from the chain */
      *chain = delsym->obj_chain;
      delsym->obj_chain = NULL;
    }
    else
      ierror("%s %s could not be found in any object",fn,delsym->name);
  }
  else
    ierror("%s %s has no object or section",fn,delsym->name);
}